

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall despot::POMDPXBelief::Update(POMDPXBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  POMDPX *pPVar1;
  value_type pSVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppSVar7;
  undefined4 extraout_var;
  size_type sVar8;
  undefined4 extraout_var_00;
  log_ostream *plVar9;
  ostream *poVar10;
  void *this_00;
  double dVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  DSPOMDP *local_258;
  int local_104;
  undefined1 local_100 [4];
  int i_4;
  undefined1 local_e8 [8];
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_belief;
  double num_effective_particles;
  State *particle_2;
  double dStack_b8;
  int i_3;
  double weight_square_sum;
  double total_weight;
  double dStack_a0;
  int i_2;
  double prob_1;
  State *pSStack_90;
  bool terminal_1;
  State *copy_1;
  State *particle_1;
  int j_1;
  int i_1;
  double prob;
  bool terminal;
  value_type local_60;
  State *copy;
  State *particle;
  int j;
  int i;
  OBS_TYPE o;
  double reward;
  vector<despot::State_*,_std::allocator<despot::State_*>_> updated;
  OBS_TYPE obs_local;
  ACT_TYPE action_local;
  POMDPXBelief *this_local;
  
  updated.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)obs;
  History::Add(&(this->super_ParticleBelief).super_Belief.history_,action,obs);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward);
  for (particle._4_4_ = 0; particle._4_4_ < this->max_iter_; particle._4_4_ = particle._4_4_ + 1) {
    for (particle._0_4_ = 0; uVar5 = (ulong)(int)particle,
        sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                          (&(this->super_ParticleBelief).particles_), uVar5 < sVar6;
        particle._0_4_ = (int)particle + 1) {
      ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          (&(this->super_ParticleBelief).particles_,(long)(int)particle);
      copy = *ppSVar7;
      iVar4 = (*(this->model_->super_MDP)._vptr_MDP[0x1a])(this->model_,copy);
      pPVar1 = this->model_;
      local_60 = (value_type)CONCAT44(extraout_var,iVar4);
      dVar11 = Random::NextDouble((Random *)&Random::RANDOM);
      iVar4 = (*(pPVar1->super_MDP)._vptr_MDP[8])
                        (dVar11,pPVar1,(value_type)CONCAT44(extraout_var,iVar4),(ulong)(uint)action,
                         &o,&j);
      prob._3_1_ = (byte)iVar4 & 1;
      (*(this->model_->super_MDP)._vptr_MDP[0xc])
                (this->model_,
                 updated.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,local_60,(ulong)(uint)action);
      if (((prob._3_1_ & 1) == 0) && ((extraout_XMM0_Qa != 0.0 || (NAN(extraout_XMM0_Qa))))) {
        local_60->weight = local_60->weight * extraout_XMM0_Qa;
        std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                  ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward,&local_60);
      }
      else {
        (*(this->model_->super_MDP)._vptr_MDP[0x1b])(this->model_,local_60);
      }
      sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward);
      sVar8 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (&(this->super_ParticleBelief).particles_);
      if (sVar6 == sVar8) break;
    }
    sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward);
    sVar8 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      (&(this->super_ParticleBelief).particles_);
    if (sVar6 == sVar8) {
      iVar4 = logging::level();
      if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
        plVar9 = logging::stream(3);
        poVar10 = std::operator<<(&plVar9->super_ostream,"[POMDPXBelief::Update] ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,particle._4_4_);
        poVar10 = std::operator<<(poVar10," iterations for normal simulations");
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      break;
    }
  }
  sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                    ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward);
  sVar8 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                    (&(this->super_ParticleBelief).particles_);
  if (sVar6 != sVar8) {
    for (particle_1._4_4_ = 0; particle_1._4_4_ < this->max_iter_ + 1;
        particle_1._4_4_ = particle_1._4_4_ + 1) {
      for (particle_1._0_4_ = 0; uVar5 = (ulong)(int)particle_1,
          sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                            (&(this->super_ParticleBelief).particles_), uVar5 < sVar6;
          particle_1._0_4_ = (int)particle_1 + 1) {
        ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                            (&(this->super_ParticleBelief).particles_,(long)(int)particle_1);
        copy_1 = *ppSVar7;
        iVar4 = (*(this->model_->super_MDP)._vptr_MDP[0x1a])(this->model_,copy_1);
        pPVar1 = this->model_;
        pSStack_90 = (State *)CONCAT44(extraout_var_00,iVar4);
        dVar11 = Random::NextDouble((Random *)&Random::RANDOM);
        bVar3 = POMDPX::NoisyStep(pPVar1,(State *)CONCAT44(extraout_var_00,iVar4),dVar11,action);
        (*(this->model_->super_MDP)._vptr_MDP[0xc])
                  (this->model_,
                   updated.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,pSStack_90,(ulong)(uint)action)
        ;
        dStack_a0 = extraout_XMM0_Qa_00;
        if ((particle_1._4_4_ == this->max_iter_) && (extraout_XMM0_Qa_00 < 1e-06)) {
          dStack_a0 = 1e-06;
        }
        if ((bVar3) || ((dStack_a0 == 0.0 && (!NAN(dStack_a0))))) {
          (*(this->model_->super_MDP)._vptr_MDP[0x1b])(this->model_,pSStack_90);
        }
        else {
          pSStack_90->weight = pSStack_90->weight * dStack_a0;
          std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                    ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward,
                     &stack0xffffffffffffff70);
        }
        sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                          ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward);
        sVar8 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                          (&(this->super_ParticleBelief).particles_);
        if (sVar6 == sVar8) break;
      }
      sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward);
      sVar8 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (&(this->super_ParticleBelief).particles_);
      if (sVar6 == sVar8) {
        iVar4 = logging::level();
        if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
          plVar9 = logging::stream(3);
          poVar10 = std::operator<<(&plVar9->super_ostream,"[POMDPXBelief::Update] ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,particle_1._4_4_);
          poVar10 = std::operator<<(poVar10," iterations for noisy simulations");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        }
        break;
      }
    }
  }
  for (total_weight._4_4_ = 0;
      sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (&(this->super_ParticleBelief).particles_),
      (ulong)(long)total_weight._4_4_ < sVar6; total_weight._4_4_ = total_weight._4_4_ + 1) {
    pPVar1 = this->model_;
    ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&(this->super_ParticleBelief).particles_,(long)total_weight._4_4_);
    (*(pPVar1->super_MDP)._vptr_MDP[0x1b])(pPVar1,*ppSVar7);
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
            (&(this->super_ParticleBelief).particles_,
             (vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward);
  dVar11 = State::Weight(&(this->super_ParticleBelief).particles_);
  dStack_b8 = 0.0;
  for (particle_2._4_4_ = 0;
      sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        (&(this->super_ParticleBelief).particles_),
      (ulong)(long)particle_2._4_4_ < sVar6; particle_2._4_4_ = particle_2._4_4_ + 1) {
    ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (&(this->super_ParticleBelief).particles_,(long)particle_2._4_4_);
    pSVar2 = *ppSVar7;
    pSVar2->weight = pSVar2->weight / dVar11;
    dStack_b8 = pSVar2->weight * pSVar2->weight + dStack_b8;
  }
  new_belief.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(1.0 / dStack_b8);
  if ((double)new_belief.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage <
      (double)(this->super_ParticleBelief).num_particles_ / 20.0) {
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
      plVar9 = logging::stream(3);
      poVar10 = std::operator<<(&plVar9->super_ostream,"[POMDPXBelief::Update] Resampling ");
      poVar10 = (ostream *)
                std::ostream::operator<<(poVar10,(this->super_ParticleBelief).num_particles_);
      poVar10 = std::operator<<(poVar10," as effective number of particles = ");
      this_00 = (void *)std::ostream::operator<<
                                  (poVar10,(double)new_belief.
                                                                                                      
                                                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  );
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    iVar4 = (this->super_ParticleBelief).num_particles_;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_100,
               &(this->super_ParticleBelief).particles_);
    local_258 = (DSPOMDP *)0x0;
    if (this->model_ != (POMDPX *)0x0) {
      local_258 = &this->model_->super_DSPOMDP;
    }
    ParticleBelief::Sample
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_e8,iVar4,
               (vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_100,local_258);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_100);
    for (local_104 = 0;
        sVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                          (&(this->super_ParticleBelief).particles_), (ulong)(long)local_104 < sVar6
        ; local_104 = local_104 + 1) {
      pPVar1 = this->model_;
      ppSVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          (&(this->super_ParticleBelief).particles_,(long)local_104);
      (*(pPVar1->super_MDP)._vptr_MDP[0x1b])(pPVar1,*ppSVar7);
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=
              (&(this->super_ParticleBelief).particles_,
               (vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_e8);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
              ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_e8);
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&reward);
  return;
}

Assistant:

void Update(ACT_TYPE action, OBS_TYPE obs) {
		history_.Add(action, obs);

		vector<State*> updated;
		double reward;
		OBS_TYPE o;

		// Update particles by looping through the particles for multiple iterations
		for (int i = 0; i < max_iter_; i++) {
			for (int j = 0; j < particles_.size(); j++) {
				State* particle = particles_[j];
				State* copy = model_->Copy(particle);

				bool terminal = model_->Step(*copy, Random::RANDOM.NextDouble(),
					action, reward, o);
				double prob = model_->ObsProb(obs, *copy, action);

				if (!terminal && prob) { // Terminal state is not required to be explicitly represented and may not have any observation
					copy->weight *= prob;
					updated.push_back(copy);
				} else {
					model_->Free(copy);
				}

				if (updated.size() == particles_.size())
					break;
			}
			if (updated.size() == particles_.size()) {
				logi << "[POMDPXBelief::Update] " << i
					<< " iterations for normal simulations" << endl;
				break;
			}
		}

		// Perform at most max_iter_ noisy iterations to generate particles, or keep
		// inconsistent particles after that
		if (updated.size() != particles_.size()) {
			for (int i = 0; i < max_iter_ + 1; i++) {
				for (int j = 0; j < particles_.size(); j++) {
					State* particle = particles_[j];
					State* copy = model_->Copy(particle);

					bool terminal = model_->NoisyStep(*copy,
						Random::RANDOM.NextDouble(), action);
					double prob = model_->ObsProb(obs, *copy, action);

					if (i == max_iter_ && prob < 1E-6) // NOTE: never kill a particle at the last iteration
						prob = 1E-6;

					if (!terminal && prob) {
						copy->weight *= prob;
						updated.push_back(copy);
					} else {
						model_->Free(copy);
					}

					if (updated.size() == particles_.size())
						break;
				}
				if (updated.size() == particles_.size()) {
					logi << "[POMDPXBelief::Update] " << i
						<< " iterations for noisy simulations" << endl;
					break;
				}
			}
		}

		for (int i = 0; i < particles_.size(); i++)
			model_->Free(particles_[i]);

		particles_ = updated;

		double total_weight = State::Weight(particles_);
		double weight_square_sum = 0;
		for (int i = 0; i < particles_.size(); i++) {
			State* particle = particles_[i];
			particle->weight /= total_weight;
			weight_square_sum += particle->weight * particle->weight;
		}

		// Resample if the effective number of particles is "small"
		double num_effective_particles = 1.0 / weight_square_sum;
		if (num_effective_particles < num_particles_ / 20.0) { // NOTE: small particles may be removed...
			logi << "[POMDPXBelief::Update] Resampling " << num_particles_
				<< " as effective number of particles = "
				<< num_effective_particles << endl;
			vector<State*> new_belief = ParticleBelief::Sample(num_particles_,
				particles_, model_);
			for (int i = 0; i < particles_.size(); i++)
				model_->Free(particles_[i]);

			particles_ = new_belief;
		}
	}